

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

aiScene * __thiscall Assimp::Importer::ReadFile(Importer *this,char *_pFile,uint pFlags)

{
  IOSystem *pIVar1;
  ProgressHandler *pPVar2;
  bool bVar3;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> _Var4;
  size_type sVar5;
  int iVar6;
  Logger *pLVar7;
  Profiler *this_00;
  _Rb_tree_header *p_Var8;
  long lVar9;
  ImporterPimpl *pIVar10;
  undefined4 extraout_var;
  ulong uVar11;
  long *plVar12;
  undefined4 extraout_var_00;
  aiScene *paVar13;
  aiMetadata *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  pointer ppBVar16;
  BaseImporter *this_01;
  char *pcVar17;
  size_t __n;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string ext;
  ScenePreprocessor pre;
  string pFile;
  ValidateDSProcess ds;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [32];
  string local_460;
  ulong local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [63];
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x233,"const aiScene *Assimp::Importer::ReadFile(const char *, unsigned int)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,_pFile,(allocator<char> *)local_438);
  WriteLogOpening(&local_460);
  pIVar10 = this->pimpl;
  if (pIVar10->mScene != (aiScene *)0x0) {
    pLVar7 = DefaultLogger::get();
    Logger::debug(pLVar7,"(Deleting previous scene)");
    FreeScene(this);
    pIVar10 = this->pimpl;
  }
  iVar6 = (*pIVar10->mIOHandler->_vptr_IOSystem[2])(pIVar10->mIOHandler,local_460._M_dataplus._M_p);
  if ((char)iVar6 == '\0') {
    std::operator+(&local_4a0,"Unable to open file \"",&local_460);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_4a0);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar15) {
      local_428[0]._0_8_ = paVar15->_M_allocated_capacity;
      local_428[0]._8_8_ = plVar12[3];
      local_438._0_8_ = local_428;
    }
    else {
      local_428[0]._0_8_ = paVar15->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar12;
    }
    local_438._8_8_ = plVar12[1];
    *plVar12 = (long)paVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    pLVar7 = DefaultLogger::get();
    Logger::error(pLVar7,(this->pimpl->mErrorString)._M_dataplus._M_p);
    bVar3 = false;
    goto LAB_002ebcf5;
  }
  iVar6 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
  if (iVar6 == 0) {
    local_4a8._M_head_impl = (Profiler *)0x0;
  }
  else {
    this_00 = (Profiler *)operator_new(0x30);
    p_Var8 = &(this_00->regions)._M_t._M_impl.super__Rb_tree_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_4a8._M_head_impl = this_00;
    local_438._0_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"total","");
    Profiling::Profiler::BeginRegion(this_00,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
  }
  SetPropertyInteger(this,"importerIndex",-1);
  pIVar10 = this->pimpl;
  ppBVar16 = (pIVar10->mImporter).
             super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pIVar10->mImporter).
      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar16) {
    uVar11 = 0;
    do {
      iVar6 = (*ppBVar16[uVar11]->_vptr_BaseImporter[3])
                        (ppBVar16[uVar11],&local_460,pIVar10->mIOHandler,0);
      if ((char)iVar6 != '\0') {
        this_01 = (this->pimpl->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11];
        SetPropertyInteger(this,"importerIndex",(int)uVar11);
        if (this_01 != (BaseImporter *)0x0) goto LAB_002eb6e9;
        break;
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      pIVar10 = this->pimpl;
      ppBVar16 = (pIVar10->mImporter).
                 super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(pIVar10->mImporter).
                                    super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar16 >> 3
                             ));
  }
  lVar9 = std::__cxx11::string::rfind((char)&local_460,0x2e);
  if (lVar9 != -1) {
    pLVar7 = DefaultLogger::get();
    Logger::info(pLVar7,"File extension not known, trying signature-based detection");
    pIVar10 = this->pimpl;
    ppBVar16 = (pIVar10->mImporter).
               super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pIVar10->mImporter).
        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppBVar16) {
      uVar11 = 0;
      do {
        iVar6 = (*ppBVar16[uVar11]->_vptr_BaseImporter[3])
                          (ppBVar16[uVar11],&local_460,pIVar10->mIOHandler,1);
        if ((char)iVar6 != '\0') {
          this_01 = (this->pimpl->mImporter).
                    super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11];
          SetPropertyInteger(this,"importerIndex",(int)uVar11);
          if (this_01 != (BaseImporter *)0x0) goto LAB_002eb6e9;
          break;
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        pIVar10 = this->pimpl;
        ppBVar16 = (pIVar10->mImporter).
                   super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(pIVar10->mImporter).
                                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar16 >>
                               3));
    }
  }
  std::operator+(&local_4a0,"No suitable reader found for the file format of file \"",&local_460);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 == paVar15) {
    local_428[0]._0_8_ = paVar15->_M_allocated_capacity;
    local_428[0]._8_8_ = plVar12[3];
    local_438._0_8_ = local_428;
  }
  else {
    local_428[0]._0_8_ = paVar15->_M_allocated_capacity;
    local_438._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar12;
  }
  local_438._8_8_ = plVar12[1];
  *plVar12 = (long)paVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != local_428) {
    operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  pLVar7 = DefaultLogger::get();
  Logger::error(pLVar7,(this->pimpl->mErrorString)._M_dataplus._M_p);
  bVar3 = false;
LAB_002ebced:
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr((unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               *)&local_4a8);
LAB_002ebcf5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    paVar13 = this->pimpl->mScene;
  }
  else {
    paVar13 = (aiScene *)0x0;
  }
  return paVar13;
LAB_002eb6e9:
  pIVar1 = this->pimpl->mIOHandler;
  local_438._0_8_ = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar6 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,local_460._M_dataplus._M_p,local_438._0_8_);
  plVar12 = (long *)CONCAT44(extraout_var,iVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != local_428) {
    operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
  }
  if (plVar12 == (long *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (**(code **)(*plVar12 + 0x30))(plVar12);
    pIVar1 = this->pimpl->mIOHandler;
    (*pIVar1->_vptr_IOSystem[5])(pIVar1,plVar12);
  }
  iVar6 = (*this_01->_vptr_BaseImporter[5])(this_01);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"unknown","");
  sVar5 = local_4a0._M_string_length;
  if ((undefined8 *)CONCAT44(extraout_var_00,iVar6) != (undefined8 *)0x0) {
    pcVar17 = *(char **)CONCAT44(extraout_var_00,iVar6);
    local_440 = uVar11;
    strlen(pcVar17);
    uVar11 = local_440;
    std::__cxx11::string::_M_replace((ulong)&local_4a0,0,(char *)sVar5,(ulong)pcVar17);
  }
  pLVar7 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                 "Found a matching importer for this file format: ",&local_4a0);
  plVar12 = (long *)std::__cxx11::string::append(local_480);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 == paVar15) {
    local_428[0]._0_8_ = paVar15->_M_allocated_capacity;
    local_428[0]._8_8_ = plVar12[3];
    local_438._0_8_ = local_428;
  }
  else {
    local_428[0]._0_8_ = paVar15->_M_allocated_capacity;
    local_438._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar12;
  }
  local_438._8_8_ = plVar12[1];
  *plVar12 = (long)paVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  Logger::info(pLVar7,(char *)local_438._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != local_428) {
    operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
  }
  if ((aiScene *)local_480._0_8_ != (aiScene *)(local_480 + 0x10)) {
    operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
  }
  pPVar2 = this->pimpl->mProgressHandler;
  (*pPVar2->_vptr_ProgressHandler[3])(pPVar2,0,uVar11 & 0xffffffff);
  _Var4._M_head_impl = local_4a8._M_head_impl;
  if (local_4a8._M_head_impl != (Profiler *)0x0) {
    local_438._0_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"import","");
    Profiling::Profiler::BeginRegion(_Var4._M_head_impl,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
  }
  paVar13 = BaseImporter::ReadFile(this_01,this,&local_460,this->pimpl->mIOHandler);
  this->pimpl->mScene = paVar13;
  pPVar2 = this->pimpl->mProgressHandler;
  (*pPVar2->_vptr_ProgressHandler[3])(pPVar2,uVar11 & 0xffffffff,uVar11 & 0xffffffff);
  _Var4._M_head_impl = local_4a8._M_head_impl;
  if (local_4a8._M_head_impl != (Profiler *)0x0) {
    local_438._0_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"import","");
    Profiling::Profiler::EndRegion(_Var4._M_head_impl,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
  }
  SetPropertyString(this,"sourceFilePath",&local_460);
  pIVar10 = this->pimpl;
  if (pIVar10->mScene == (aiScene *)0x0) {
    std::__cxx11::string::_M_assign((string *)&pIVar10->mErrorString);
LAB_002ebc70:
    SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
    _Var4._M_head_impl = local_4a8._M_head_impl;
    bVar3 = true;
    if (local_4a8._M_head_impl != (Profiler *)0x0) {
      local_438._0_8_ = local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"total","");
      Profiling::Profiler::EndRegion(_Var4._M_head_impl,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != local_428) {
        operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
      }
    }
  }
  else {
    paVar14 = pIVar10->mScene->mMetaData;
    if (paVar14 == (aiMetadata *)0x0) {
      paVar14 = (aiMetadata *)operator_new(0x18);
      paVar14->mNumProperties = 0;
      paVar14->mKeys = (aiString *)0x0;
      paVar14->mValues = (aiMetadataEntry *)0x0;
      pIVar10->mScene->mMetaData = paVar14;
      paVar14 = this->pimpl->mScene->mMetaData;
    }
    else {
      uVar11 = (ulong)paVar14->mNumProperties;
      if (uVar11 != 0) {
        pcVar17 = paVar14->mKeys->data;
        do {
          iVar6 = strncmp(pcVar17,"SourceAsset_Format",(ulong)((aiString *)(pcVar17 + -4))->length);
          if (iVar6 == 0) goto LAB_002ebb73;
          pcVar17 = pcVar17 + 0x404;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
    }
    local_480._0_8_ = local_480 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"SourceAsset_Format","");
    __n = 0x3ff;
    if ((local_4a0._M_string_length & 0xfffffc00) == 0) {
      __n = local_4a0._M_string_length & 0xffffffff;
    }
    local_438._0_4_ = (int)__n;
    memcpy(local_438 + 4,local_4a0._M_dataplus._M_p,__n);
    local_438[__n + 4] = 0;
    aiMetadata::Add<aiString>(paVar14,(string *)local_480,(aiString *)local_438);
    if ((aiScene *)local_480._0_8_ != (aiScene *)(local_480 + 0x10)) {
      operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
    }
LAB_002ebb73:
    if ((pFlags >> 10 & 1) == 0) {
LAB_002ebbb6:
      _Var4._M_head_impl = local_4a8._M_head_impl;
      if (local_4a8._M_head_impl != (Profiler *)0x0) {
        local_438._0_8_ = local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"preprocess","");
        Profiling::Profiler::BeginRegion(_Var4._M_head_impl,(string *)local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
        }
      }
      local_480._0_8_ = this->pimpl->mScene;
      ScenePreprocessor::ProcessScene((ScenePreprocessor *)local_480);
      _Var4._M_head_impl = local_4a8._M_head_impl;
      if (local_4a8._M_head_impl != (Profiler *)0x0) {
        local_438._0_8_ = local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"preprocess","");
        Profiling::Profiler::EndRegion(_Var4._M_head_impl,(string *)local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
        }
      }
      ApplyPostProcessing(this,pFlags & 0xfffffbff);
      goto LAB_002ebc70;
    }
    ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_438);
    BaseProcess::ExecuteOnScene((BaseProcess *)local_438,this);
    paVar13 = this->pimpl->mScene;
    ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_438);
    if (paVar13 != (aiScene *)0x0) goto LAB_002ebbb6;
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  goto LAB_002ebced;
}

Assistant:

const aiScene* Importer::ReadFile( const char* _pFile, unsigned int pFlags) {
    ai_assert(nullptr != pimpl);
    
    ASSIMP_BEGIN_EXCEPTION_REGION();
    const std::string pFile(_pFile);

    // ----------------------------------------------------------------------
    // Put a large try block around everything to catch all std::exception's
    // that might be thrown by STL containers or by new().
    // ImportErrorException's are throw by ourselves and caught elsewhere.
    //-----------------------------------------------------------------------

    WriteLogOpening(pFile);

#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    try
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    {
        // Check whether this Importer instance has already loaded
        // a scene. In this case we need to delete the old one
        if (pimpl->mScene)  {

            ASSIMP_LOG_DEBUG("(Deleting previous scene)");
            FreeScene();
        }

        // First check if the file is accessible at all
        if( !pimpl->mIOHandler->Exists( pFile)) {

            pimpl->mErrorString = "Unable to open file \"" + pFile + "\".";
            ASSIMP_LOG_ERROR(pimpl->mErrorString);
            return nullptr;
        }

        std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
        if (profiler) {
            profiler->BeginRegion("total");
        }

        // Find an worker class which can handle the file
        BaseImporter* imp = nullptr;
        SetPropertyInteger("importerIndex", -1);
        for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {

            if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, false)) {
                imp = pimpl->mImporter[a];
                SetPropertyInteger("importerIndex", a);
                break;
            }
        }

        if (!imp)   {
            // not so bad yet ... try format auto detection.
            const std::string::size_type s = pFile.find_last_of('.');
            if (s != std::string::npos) {
                ASSIMP_LOG_INFO("File extension not known, trying signature-based detection");
                for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {
                    if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, true)) {
                        imp = pimpl->mImporter[a];
                        SetPropertyInteger("importerIndex", a);
                        break;
                    }
                }
            }
            // Put a proper error message if no suitable importer was found
            if( !imp)   {
                pimpl->mErrorString = "No suitable reader found for the file format of file \"" + pFile + "\".";
                ASSIMP_LOG_ERROR(pimpl->mErrorString);
                return nullptr;
            }
        }

        // Get file size for progress handler
        IOStream * fileIO = pimpl->mIOHandler->Open( pFile );
        uint32_t fileSize = 0;
        if (fileIO)
        {
            fileSize = static_cast<uint32_t>(fileIO->FileSize());
            pimpl->mIOHandler->Close( fileIO );
        }

        // Dispatch the reading to the worker class for this format
        const aiImporterDesc *desc( imp->GetInfo() );
        std::string ext( "unknown" );
        if ( nullptr != desc ) {
            ext = desc->mName;
        }
        ASSIMP_LOG_INFO("Found a matching importer for this file format: " + ext + "." );
        pimpl->mProgressHandler->UpdateFileRead( 0, fileSize );

        if (profiler) {
            profiler->BeginRegion("import");
        }

        pimpl->mScene = imp->ReadFile( this, pFile, pimpl->mIOHandler);
        pimpl->mProgressHandler->UpdateFileRead( fileSize, fileSize );

        if (profiler) {
            profiler->EndRegion("import");
        }

        SetPropertyString("sourceFilePath", pFile);

        // If successful, apply all active post processing steps to the imported data
        if( pimpl->mScene)  {
            if (!pimpl->mScene->mMetaData || !pimpl->mScene->mMetaData->HasKey(AI_METADATA_SOURCE_FORMAT)) {
                if (!pimpl->mScene->mMetaData) {
                    pimpl->mScene->mMetaData = new aiMetadata;
                }
                pimpl->mScene->mMetaData->Add(AI_METADATA_SOURCE_FORMAT, aiString(ext));
            }

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
            // The ValidateDS process is an exception. It is executed first, even before ScenePreprocessor is called.
            if (pFlags & aiProcess_ValidateDataStructure) {
                ValidateDSProcess ds;
                ds.ExecuteOnScene (this);
                if (!pimpl->mScene) {
                    return nullptr;
                }
            }
#endif // no validation

            // Preprocess the scene and prepare it for post-processing
            if (profiler) {
                profiler->BeginRegion("preprocess");
            }

            ScenePreprocessor pre(pimpl->mScene);
            pre.ProcessScene();

            if (profiler) {
                profiler->EndRegion("preprocess");
            }

            // Ensure that the validation process won't be called twice
            ApplyPostProcessing(pFlags & (~aiProcess_ValidateDataStructure));
        }
        // if failed, extract the error string
        else if( !pimpl->mScene) {
            pimpl->mErrorString = imp->GetErrorText();
        }

        // clear any data allocated by post-process steps
        pimpl->mPPShared->Clean();

        if (profiler) {
            profiler->EndRegion("total");
        }
    }
#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    catch (std::exception &e) {
#if (defined _MSC_VER) &&   (defined _CPPRTTI)
        // if we have RTTI get the full name of the exception that occurred
        pimpl->mErrorString = std::string(typeid( e ).name()) + ": " + e.what();
#else
        pimpl->mErrorString = std::string("std::exception: ") + e.what();
#endif

        ASSIMP_LOG_ERROR(pimpl->mErrorString);
        delete pimpl->mScene; pimpl->mScene = nullptr;
    }
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS

    // either successful or failure - the pointer expresses it anyways
    ASSIMP_END_EXCEPTION_REGION_WITH_ERROR_STRING(const aiScene*, pimpl->mErrorString);
    
    return pimpl->mScene;
}